

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowConstantAggregator::WindowConstantAggregator
          (WindowConstantAggregator *this,BoundWindowExpression *wexpr,
          WindowSharedExpressions *shared,ClientContext *context)

{
  bool bVar1;
  unsigned_long *__args;
  long in_RSI;
  BoundWindowExpression *in_RDI;
  WindowAggregator *unaff_retaddr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  BoundWindowExpression *in_stack_ffffffffffffff88;
  ClientContext *in_stack_ffffffffffffff90;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_30;
  long local_28;
  long local_10;
  BoundWindowExpression *wexpr_00;
  
  local_10 = in_RSI;
  wexpr_00 = in_RDI;
  RebindAggregate(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  WindowAggregator::WindowAggregator(unaff_retaddr,wexpr_00);
  ((_Vector_impl_data *)&(in_RDI->super_Expression).super_BaseExpression._vptr_BaseExpression)->
  _M_start = (pointer)&PTR__WindowConstantAggregator_03534ce8;
  local_28 = local_10 + 0x68;
  local_30._M_current =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)in_stack_ffffffffffffff88);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator*(&local_30);
    in_stack_ffffffffffffff90 =
         (ClientContext *)
         &in_RDI[1].partitions.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    __args = (unsigned_long *)
             WindowSharedExpressions::RegisterSink
                       ((WindowSharedExpressions *)in_stack_ffffffffffffff90,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_ffffffffffffff88);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,__args);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

WindowConstantAggregator::WindowConstantAggregator(BoundWindowExpression &wexpr, WindowSharedExpressions &shared,
                                                   ClientContext &context)
    : WindowAggregator(RebindAggregate(context, wexpr)) {

	// We only need these values for Sink
	for (auto &child : wexpr.children) {
		child_idx.emplace_back(shared.RegisterSink(child));
	}
}